

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O0

void * tclpkcs11_int_lookup_sym(void *handle,char *sym)

{
  void *pvVar1;
  char *sym_local;
  void *handle_local;
  
  pvVar1 = (void *)dlsym(handle,sym);
  return pvVar1;
}

Assistant:

MODULE_SCOPE void *tclpkcs11_int_lookup_sym(void *handle, const char *sym) {
  #if defined(TCL_INCLUDES_LOADFILE)
  Tcl_LoadHandle *tcl_handle;
  void *retval;

  tcl_handle = handle;

  retval = Tcl_FindSymbol(NULL, *tcl_handle, sym);

  return(retval);
  #elif defined(HAVE_DLOPEN)
  return(dlsym(handle, sym));
  #elif defined(HAVE_SHL_LOAD)
  void *retval;
  int shl_findsym_ret;

  shl_findsym_ret = shl_findsym(handle, sym, TYPE_PROCEDURE, &retval);
  if (shl_findsym_ret != 0) {
    return(NULL);
  }

  return(retval);
  #elif defined(_WIN32)
  return(GetProcAddress(handle, sym));
  #endif
  return(NULL);
}